

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_stats_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  __m256i alVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  bool bVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  parasail_result_t *ppVar23;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *ptr;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int64_t *ptr_06;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  __m256i *palVar31;
  int iVar32;
  longlong lVar33;
  undefined8 uVar34;
  uint uVar35;
  longlong lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  bool bVar41;
  undefined1 auVar43 [16];
  undefined1 auVar42 [16];
  undefined1 auVar51 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar44 [16];
  undefined1 auVar50 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [32];
  undefined1 in_ZMM6 [64];
  undefined1 in_ZMM7 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  uint uVar80;
  undefined4 uVar81;
  undefined4 in_stack_fffffffffffffc70;
  int iVar82;
  ulong uVar83;
  undefined1 local_2f8 [32];
  int local_2d8;
  undefined1 local_238 [32];
  
  auVar44 = in_ZMM7._0_16_;
  auVar73 = in_ZMM6._0_32_;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar6 = (profile->profile64).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_stats_scan_profile_avx2_256_64_cold_1();
        }
        else {
          uVar35 = uVar5 - 1;
          uVar83 = (ulong)uVar5 + 3;
          uVar40 = uVar83 >> 2;
          uVar10 = (ulong)uVar35 % uVar40;
          iVar19 = (int)(uVar35 / uVar40);
          pvVar8 = (profile->profile64).matches;
          pvVar9 = (profile->profile64).similar;
          uVar39 = CONCAT44(0,open);
          iVar28 = -open;
          iVar21 = ppVar7->min;
          local_238._0_4_ = iVar28;
          uVar30 = 0x8000000000000000 - (long)iVar21;
          if (iVar21 != iVar28 && SBORROW4(iVar21,iVar28) == iVar21 + open < 0) {
            uVar30 = uVar39 | 0x8000000000000000;
          }
          iVar21 = ppVar7->max;
          ppVar23 = parasail_result_new_stats();
          if (ppVar23 != (parasail_result_t *)0x0) {
            ppVar23->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar23->flag | 0x4810402;
            b = parasail_memalign___m256i(0x20,uVar40);
            b_00 = parasail_memalign___m256i(0x20,uVar40);
            b_01 = parasail_memalign___m256i(0x20,uVar40);
            b_02 = parasail_memalign___m256i(0x20,uVar40);
            uVar80 = (uint)uVar40;
            uVar81 = 0;
            ptr = parasail_memalign___m256i(0x20,uVar40);
            b_03 = parasail_memalign___m256i(0x20,uVar40);
            b_04 = parasail_memalign___m256i(0x20,uVar40);
            b_05 = parasail_memalign___m256i(0x20,uVar40);
            ptr_00 = parasail_memalign___m256i(0x20,CONCAT44(uVar81,uVar80));
            ptr_01 = parasail_memalign___m256i(0x20,CONCAT44(uVar81,uVar80));
            ptr_02 = parasail_memalign___m256i(0x20,CONCAT44(uVar81,uVar80));
            ptr_03 = parasail_memalign___m256i(0x20,CONCAT44(uVar81,uVar80));
            ptr_04 = parasail_memalign___m256i(0x20,CONCAT44(uVar81,uVar80));
            ptr_05 = parasail_memalign___m256i(0x20,CONCAT44(uVar81,uVar80));
            ptr_06 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            auVar53._8_8_ = 0;
            auVar53._0_8_ = b;
            auVar58._8_8_ = 0;
            auVar58._0_8_ = b_00;
            auVar53 = vpunpcklqdq_avx(auVar53,auVar58);
            auVar42._8_8_ = 0;
            auVar42._0_8_ = b_01;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = b_02;
            auVar58 = vpunpcklqdq_avx(auVar42,auVar51);
            auVar42 = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar53;
            auVar51 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = ptr;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = b_03;
            auVar53 = vpunpcklqdq_avx(auVar52,auVar59);
            auVar60._8_8_ = 0;
            auVar60._0_8_ = b_04;
            auVar63._8_8_ = 0;
            auVar63._0_8_ = b_05;
            auVar58 = vpunpcklqdq_avx(auVar60,auVar63);
            auVar53 = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar53;
            auVar58 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
            auVar61 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar47._0_8_ = -(ulong)(auVar42._0_8_ == 0);
            auVar47._8_8_ = -(ulong)(auVar42._8_8_ == 0);
            auVar47._16_8_ = -(ulong)(auVar51._0_8_ == 0);
            auVar47._24_8_ = -(ulong)(auVar51._8_8_ == 0);
            auVar55._0_8_ = -(ulong)(auVar53._0_8_ == 0);
            auVar55._8_8_ = -(ulong)(auVar53._8_8_ == 0);
            auVar55._16_8_ = -(ulong)(auVar58._0_8_ == 0);
            auVar55._24_8_ = -(ulong)(auVar58._8_8_ == 0);
            auVar47 = vpackssdw_avx2(auVar47,auVar55);
            if (((((ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0) &&
                  ptr_05 != (__m256i *)0x0) &&
                 ((ptr_01 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) && ptr_02 != (__m256i *)0x0
                 )) && ptr_06 != (int64_t *)0x0) &&
                ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar47 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar47 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar47 >> 0x7f,0) == '\0') &&
                   (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar47 >> 0xbf,0) == '\0') &&
                 (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar47[0x1f])) {
              iVar20 = s2Len + -1;
              iVar82 = -iVar19;
              iVar32 = iVar82 + 3;
              auVar45._8_4_ = gap;
              auVar45._0_8_ = CONCAT44(0,gap);
              auVar45._12_4_ = 0;
              auVar45._16_4_ = gap;
              auVar45._20_4_ = 0;
              auVar45._24_4_ = gap;
              auVar45._28_4_ = 0;
              uVar30 = uVar30 + 1;
              lVar37 = 0x7ffffffffffffffe - (long)iVar21;
              auVar46._8_8_ = uVar83;
              auVar46._0_8_ = uVar83;
              auVar46._16_8_ = uVar83;
              auVar46._24_8_ = uVar83;
              auVar47 = vpsrlq_avx2(auVar46,2);
              auVar46 = vpblendd_avx2(auVar47,ZEXT1632((undefined1  [16])0x0),3);
              lVar24 = (long)(int)-(uVar80 * gap);
              auVar48._8_8_ = lVar24;
              auVar48._0_8_ = lVar24;
              auVar48._16_8_ = lVar24;
              auVar48._24_8_ = lVar24;
              auVar47 = vpblendd_avx2(auVar48,ZEXT1632((undefined1  [16])0x0),3);
              auVar47 = vpaddq_avx2(ZEXT832(uVar30),auVar47);
              alVar13[0]._4_4_ = uVar81;
              alVar13[0]._0_4_ = uVar80;
              alVar13[1]._0_4_ = in_stack_fffffffffffffc70;
              alVar13[1]._4_4_ = iVar20;
              alVar13[2] = uVar30;
              alVar13[3]._0_4_ = uVar35;
              alVar13[3]._4_4_ = iVar19;
              uVar40 = uVar30;
              parasail_memset___m256i(b_03,alVar13,CONCAT44(uVar81,uVar80));
              alVar2[0]._4_4_ = uVar81;
              alVar2[0]._0_4_ = uVar80;
              alVar2[1]._0_4_ = in_stack_fffffffffffffc70;
              alVar2[1]._4_4_ = iVar20;
              alVar2[2] = uVar40;
              alVar2[3]._0_4_ = uVar35;
              alVar2[3]._4_4_ = iVar19;
              parasail_memset___m256i(b_04,alVar2,CONCAT44(uVar81,uVar80));
              alVar3[0]._4_4_ = uVar81;
              alVar3[0]._0_4_ = uVar80;
              alVar3[1]._0_4_ = in_stack_fffffffffffffc70;
              alVar3[1]._4_4_ = iVar20;
              alVar3[2] = uVar40;
              alVar3[3]._0_4_ = uVar35;
              alVar3[3]._4_4_ = iVar19;
              parasail_memset___m256i(b_05,alVar3,CONCAT44(uVar81,uVar80));
              alVar4[0]._4_4_ = uVar81;
              alVar4[0]._0_4_ = uVar80;
              alVar4[1]._0_4_ = in_stack_fffffffffffffc70;
              alVar4[1]._4_4_ = iVar20;
              alVar4[2] = uVar40;
              alVar4[3]._0_4_ = uVar35;
              alVar4[3]._4_4_ = iVar19;
              parasail_memset___m256i(b,alVar4,CONCAT44(uVar81,uVar80));
              c[0]._4_4_ = uVar81;
              c[0]._0_4_ = uVar80;
              c[1]._0_4_ = in_stack_fffffffffffffc70;
              c[1]._4_4_ = iVar20;
              c[2] = uVar40;
              c[3]._0_4_ = uVar35;
              c[3]._4_4_ = iVar19;
              parasail_memset___m256i(b_00,c,CONCAT44(uVar81,uVar80));
              c_00[0]._4_4_ = uVar81;
              c_00[0]._0_4_ = uVar80;
              c_00[1]._0_4_ = in_stack_fffffffffffffc70;
              c_00[1]._4_4_ = iVar20;
              c_00[2] = uVar40;
              c_00[3]._0_4_ = uVar35;
              c_00[3]._4_4_ = iVar19;
              parasail_memset___m256i(b_01,c_00,CONCAT44(uVar81,uVar80));
              c_01[0]._4_4_ = uVar81;
              c_01[0]._0_4_ = uVar80;
              c_01[1]._0_4_ = in_stack_fffffffffffffc70;
              c_01[1]._4_4_ = iVar20;
              c_01[2] = uVar40;
              c_01[3]._0_4_ = uVar35;
              c_01[3]._4_4_ = iVar19;
              parasail_memset___m256i(b_02,c_01,CONCAT44(uVar81,uVar80));
              auVar68._8_4_ = open;
              auVar68._0_8_ = uVar39;
              auVar68._12_4_ = 0;
              auVar68._16_4_ = open;
              auVar68._20_4_ = 0;
              auVar68._24_4_ = open;
              auVar68._28_4_ = 0;
              auVar68 = vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar68);
              uVar25 = (ulong)(uVar80 - 1);
              lVar24 = uVar25 << 5;
              auVar56._8_8_ = 1;
              auVar56._0_8_ = 1;
              auVar56._16_8_ = 1;
              auVar56._24_8_ = 1;
              auVar55 = vpcmpeqd_avx2(auVar61,auVar61);
              uVar22 = uVar80;
              do {
                *(undefined1 (*) [32])((long)*ptr_04 + lVar24) = auVar68;
                *(undefined1 (*) [32])((long)*ptr_05 + lVar24) = auVar56;
                auVar68 = vpsubq_avx2(auVar68,auVar45);
                auVar56 = vpsubq_avx2(auVar56,auVar55);
                lVar24 = lVar24 + -0x20;
                uVar29 = uVar22 - 1;
                bVar41 = 0 < (int)uVar22;
                uVar22 = uVar29;
              } while (uVar29 != 0 && bVar41);
              bVar41 = s1_beg != 0;
              lVar24 = (long)iVar28;
              auVar61._4_4_ = uVar80;
              auVar61._0_4_ = uVar80;
              auVar61._8_4_ = uVar80;
              auVar61._12_4_ = uVar80;
              auVar61._16_4_ = uVar80;
              auVar61._20_4_ = uVar80;
              auVar61._24_4_ = uVar80;
              auVar61._28_4_ = uVar80;
              auVar49._8_4_ = gap;
              auVar49._0_8_ = CONCAT44(0,gap);
              auVar49._12_4_ = 0;
              auVar49._16_4_ = gap;
              auVar49._20_4_ = 0;
              auVar49._24_4_ = gap;
              auVar49._28_4_ = 0;
              auVar57._8_8_ = lVar24;
              auVar57._0_8_ = lVar24;
              auVar57._16_8_ = lVar24;
              auVar57._24_8_ = lVar24;
              auVar61 = vpmuldq_avx2(auVar61,_DAT_00908b60);
              auVar64[1] = bVar41;
              auVar64[0] = bVar41;
              auVar64[2] = bVar41;
              auVar64[3] = bVar41;
              auVar64[4] = bVar41;
              auVar64[5] = bVar41;
              auVar64[6] = bVar41;
              auVar64[7] = bVar41;
              auVar64[8] = bVar41;
              auVar64[9] = bVar41;
              auVar64[10] = bVar41;
              auVar64[0xb] = bVar41;
              auVar64[0xc] = bVar41;
              auVar64[0xd] = bVar41;
              auVar64[0xe] = bVar41;
              auVar64[0xf] = bVar41;
              lVar24 = 0;
              auVar53 = vpslld_avx(auVar64,0x1f);
              auVar53 = vpsrad_avx(auVar53,0x1f);
              auVar55 = vpmovsxdq_avx2(auVar53);
              palVar31 = ptr;
              do {
                auVar67._8_8_ = lVar24;
                auVar67._0_8_ = lVar24;
                auVar67._16_8_ = lVar24;
                auVar67._24_8_ = lVar24;
                auVar68 = vpaddq_avx2(auVar61,auVar67);
                auVar56 = vpmuludq_avx2(auVar68,auVar49);
                auVar68 = vpsrlq_avx2(auVar68,0x20);
                auVar68 = vpmuludq_avx2(auVar68,auVar49);
                auVar68 = vpsllq_avx2(auVar68,0x20);
                auVar68 = vpaddq_avx2(auVar56,auVar68);
                auVar68 = vpsubq_avx2(auVar57,auVar68);
                alVar13 = (__m256i)vpandn_avx2(auVar55,auVar68);
                *palVar31 = alVar13;
                lVar24 = lVar24 + 1;
                palVar31 = palVar31 + 1;
              } while (CONCAT44(uVar81,uVar80) != lVar24);
              *ptr_06 = 0;
              lVar24 = (ulong)(uint)s2Len - 1;
              auVar71._8_8_ = lVar24;
              auVar71._0_8_ = lVar24;
              auVar71._16_8_ = lVar24;
              auVar71._24_8_ = lVar24;
              auVar43._4_4_ = gap;
              auVar43._0_4_ = gap;
              auVar43._8_4_ = gap;
              auVar43._12_4_ = gap;
              auVar54._4_4_ = iVar28;
              auVar54._0_4_ = iVar28;
              auVar54._8_4_ = iVar28;
              auVar54._12_4_ = iVar28;
              auVar53 = vpmovsxbd_avx(ZEXT416(0x4030201));
              uVar26 = 0;
              auVar55 = vpmovsxbq_avx2(ZEXT416(0x3020100));
              auVar69._8_8_ = 0x8000000000000000;
              auVar69._0_8_ = 0x8000000000000000;
              auVar69._16_8_ = 0x8000000000000000;
              auVar69._24_8_ = 0x8000000000000000;
              auVar73 = vpcmpeqd_avx2(auVar73,auVar73);
              auVar44 = vpcmpeqd_avx(auVar44,auVar44);
              auVar74._8_4_ = 4;
              auVar74._0_8_ = 0x400000004;
              auVar74._12_4_ = 4;
              do {
                if (s2_beg == 0) {
                  auVar58 = vpaddd_avx(auVar53,auVar44);
                  auVar58 = vpmulld_avx(auVar58,auVar43);
                  auVar58 = vpsubd_avx(auVar54,auVar58);
                  auVar61 = vpmovsxdq_avx2(auVar58);
                  auVar76 = ZEXT3264(auVar61);
                }
                else {
                  auVar76 = ZEXT1664((undefined1  [16])0x0);
                }
                auVar77._8_8_ = uVar26;
                auVar77._0_8_ = uVar26;
                auVar77._16_8_ = uVar26;
                auVar77._24_8_ = uVar26;
                auVar61 = vpor_avx2(auVar77,auVar55);
                auVar68 = vpcmpgtq_avx2(auVar61 ^ auVar69,auVar71 ^ auVar69);
                auVar68 = auVar68 ^ auVar73;
                auVar61 = vpmaskmovq_avx2(auVar68,auVar76._0_32_);
                *(undefined1 (*) [32])(ptr_06 + uVar26 + 1) = auVar61;
                uVar26 = uVar26 + 4;
                auVar53 = vpaddd_avx(auVar74,auVar53);
              } while ((s2Len + 3U & 0xfffffffc) != uVar26);
              lVar24 = CONCAT44(uVar81,uVar80) << 5;
              auVar73._8_8_ = uVar30;
              auVar73._0_8_ = uVar30;
              auVar73._16_8_ = uVar30;
              auVar73._24_8_ = uVar30;
              auVar62 = ZEXT3264(auVar73);
              auVar66 = ZEXT3264(auVar73);
              auVar70 = ZEXT3264(auVar73);
              auVar72 = ZEXT3264(auVar73);
              auVar79 = ZEXT3264(auVar73);
              auVar75 = ZEXT3264(CONCAT824(lVar37,CONCAT816(lVar37,CONCAT88(lVar37,lVar37))));
              uVar26 = 0;
              local_2d8 = iVar20;
              do {
                auVar49 = auVar72._0_32_;
                alVar13 = ptr[uVar25];
                alVar2 = b_03[uVar25];
                alVar3 = b_04[uVar25];
                alVar4 = b_05[uVar25];
                auVar44 = alVar13._0_16_;
                auVar65._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar44;
                auVar65._16_16_ = ZEXT116(0) * alVar13._16_16_ + ZEXT116(1) * auVar44;
                auVar73 = vpalignr_avx2((undefined1  [32])alVar13,auVar65,8);
                auVar55 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8);
                auVar55 = vpalignr_avx2((undefined1  [32])alVar2,auVar55,8);
                auVar61 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,8);
                auVar61 = vpalignr_avx2((undefined1  [32])alVar3,auVar61,8);
                auVar56 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                auVar56 = vpalignr_avx2((undefined1  [32])alVar4,auVar56,8);
                auVar73 = vpblendd_avx2(auVar73,ZEXT832((ulong)ptr_06[uVar26]),3);
                lVar38 = (long)ppVar7->mapper[(byte)s2[uVar26]] * (ulong)uVar80 * 0x20;
                auVar11._8_8_ = uVar30;
                auVar11._0_8_ = uVar30;
                auVar11._16_8_ = uVar30;
                auVar11._24_8_ = uVar30;
                auVar48 = vpsubq_avx2(auVar11,(undefined1  [32])*ptr_04);
                local_2f8 = ZEXT1632(ZEXT816(0));
                lVar27 = 0;
                auVar72 = ZEXT1664((undefined1  [16])0x0);
                auVar78 = ZEXT864(0) << 0x40;
                do {
                  auVar77 = vpaddq_avx2(auVar73,*(undefined1 (*) [32])
                                                 ((long)pvVar6 + lVar27 + lVar38));
                  auVar73 = *(undefined1 (*) [32])((long)*ptr + lVar27);
                  auVar65 = vpaddq_avx2(auVar55,*(undefined1 (*) [32])
                                                 ((long)pvVar8 + lVar27 + lVar38));
                  auVar12 = vpaddq_avx2(auVar61,*(undefined1 (*) [32])
                                                 ((long)pvVar9 + lVar27 + lVar38));
                  auVar55 = *(undefined1 (*) [32])((long)*b_03 + lVar27);
                  auVar61 = *(undefined1 (*) [32])((long)*b_04 + lVar27);
                  auVar48 = vpaddq_avx2(auVar48,*(undefined1 (*) [32])((long)*ptr_04 + lVar27));
                  auVar69 = vpcmpgtq_avx2(auVar48,auVar11);
                  auVar11 = vblendvpd_avx(auVar11,auVar48,auVar69);
                  auVar48 = vpcmpeqd_avx2(auVar48,auVar48);
                  auVar50 = vpsubq_avx2(auVar56,auVar48);
                  auVar56 = *(undefined1 (*) [32])((long)*b_05 + lVar27);
                  auVar57 = vblendvpd_avx(auVar78._0_32_,auVar68,auVar69);
                  auVar78 = ZEXT3264(auVar57);
                  auVar67 = vblendvpd_avx(auVar72._0_32_,auVar76._0_32_,auVar69);
                  auVar72 = ZEXT3264(auVar67);
                  auVar14._8_4_ = open;
                  auVar14._0_8_ = uVar39;
                  auVar14._12_4_ = 0;
                  auVar14._16_4_ = open;
                  auVar14._20_4_ = 0;
                  auVar14._24_4_ = open;
                  auVar14._28_4_ = 0;
                  auVar71 = vpsubq_avx2(auVar73,auVar14);
                  auVar68 = vpaddq_avx2(local_238,*(undefined1 (*) [32])((long)*ptr_05 + lVar27));
                  local_2f8 = vblendvpd_avx(local_2f8,auVar68,auVar69);
                  auVar68 = vpsubq_avx2(*(undefined1 (*) [32])((long)*b + lVar27),auVar45);
                  auVar48 = vpcmpgtq_avx2(auVar71,auVar68);
                  auVar68 = vblendvpd_avx(auVar68,auVar71,auVar48);
                  auVar69 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_00 + lVar27),auVar55,
                                          auVar48);
                  auVar71 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_01 + lVar27),auVar61,
                                          auVar48);
                  auVar48 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_02 + lVar27),auVar56,
                                          auVar48);
                  auVar15 = vpsubq_avx2(auVar48,_DAT_00909280);
                  auVar14 = vpcmpgtq_avx2(auVar68,auVar77);
                  *(undefined1 (*) [32])((long)*b + lVar27) = auVar68;
                  auVar48 = vblendvpd_avx(auVar77,auVar68,auVar14);
                  *(undefined1 (*) [32])((long)*b_00 + lVar27) = auVar69;
                  auVar68 = vblendvpd_avx(auVar65,auVar69,auVar14);
                  *(undefined1 (*) [32])((long)*b_01 + lVar27) = auVar71;
                  auVar69 = vblendvpd_avx(auVar12,auVar71,auVar14);
                  auVar76 = ZEXT3264(auVar69);
                  local_238 = vblendvpd_avx(auVar50,auVar15,auVar14);
                  *(undefined1 (*) [32])((long)*b_02 + lVar27) = auVar15;
                  *(undefined1 (*) [32])((long)*ptr + lVar27) = auVar77;
                  *(undefined1 (*) [32])((long)*b_03 + lVar27) = auVar65;
                  *(undefined1 (*) [32])((long)*b_04 + lVar27) = auVar12;
                  *(undefined1 (*) [32])((long)*b_05 + lVar27) = auVar50;
                  lVar27 = lVar27 + 0x20;
                } while (lVar24 != lVar27);
                auVar77 = vpermpd_avx2(auVar48,0x90);
                auVar73 = vperm2f128_avx(auVar68,auVar68,8);
                auVar68 = vpalignr_avx2(auVar68,auVar73,8);
                auVar73 = vperm2f128_avx(auVar69,auVar69,8);
                auVar69 = vpalignr_avx2(auVar69,auVar73,8);
                auVar76 = ZEXT3264(auVar69);
                auVar73 = vperm2f128_avx(local_238,local_238,8);
                local_238 = vpalignr_avx2(local_238,auVar73,8);
                auVar73 = vblendpd_avx(auVar77,ZEXT832((ulong)ptr_06[uVar26 + 1]),1);
                auVar55 = vpaddq_avx2(auVar73,(undefined1  [32])*ptr_04);
                auVar71 = vpcmpgtq_avx2(auVar11,auVar55);
                auVar56 = vblendvpd_avx(auVar55,auVar11,auVar71);
                auVar48 = vblendvpd_avx(auVar68,auVar57,auVar71);
                auVar61 = vblendvpd_avx(auVar69,auVar67,auVar71);
                auVar55 = vpaddq_avx2(local_238,(undefined1  [32])*ptr_05);
                uVar1 = uVar26 + 1;
                auVar55 = vblendvpd_avx(auVar55,local_2f8,auVar71);
                bVar41 = true;
                do {
                  bVar18 = bVar41;
                  auVar57 = vperm2f128_avx(auVar56,auVar56,8);
                  auVar57 = vpalignr_avx2(auVar56,auVar57,8);
                  auVar67 = vpaddq_avx2(auVar47,auVar57);
                  auVar57 = vperm2f128_avx(auVar48,auVar48,8);
                  auVar71 = vpalignr_avx2(auVar48,auVar57,8);
                  auVar57 = vperm2f128_avx(auVar61,auVar61,8);
                  auVar11 = vpalignr_avx2(auVar61,auVar57,8);
                  auVar57 = vperm2f128_avx(auVar55,auVar55,8);
                  auVar57 = vpalignr_avx2(auVar55,auVar57,8);
                  auVar57 = vpaddq_avx2(auVar46,auVar57);
                  auVar65 = vpcmpgtq_avx2(auVar56,auVar67);
                  auVar56 = vblendvpd_avx(auVar67,auVar56,auVar65);
                  auVar48 = vblendvpd_avx(auVar71,auVar48,auVar65);
                  auVar61 = vblendvpd_avx(auVar11,auVar61,auVar65);
                  auVar55 = vblendvpd_avx(auVar57,auVar55,auVar65);
                  bVar41 = false;
                } while (bVar18);
                auVar57 = vperm2f128_avx(auVar56,auVar56,8);
                auVar71 = vpalignr_avx2(auVar56,auVar57,8);
                auVar56 = vperm2f128_avx(auVar48,auVar48,8);
                auVar57 = vpalignr_avx2(auVar48,auVar56,8);
                auVar56 = vperm2f128_avx(auVar61,auVar61,8);
                auVar67 = vpalignr_avx2(auVar61,auVar56,8);
                auVar11 = vperm2f128_avx(auVar55,auVar55,8);
                auVar71 = vpaddq_avx2(auVar71,ZEXT832(uVar30));
                auVar65 = vpcmpgtq_avx2(auVar71,auVar73);
                auVar73 = vblendpd_avx(ZEXT832((ulong)ptr_06[uVar26 + 1]),auVar77,0xe);
                auVar61 = vpcmpgtq_avx2(auVar71,auVar73);
                auVar48 = vblendvpd_avx(auVar73,auVar71,auVar61);
                auVar61 = vblendvpd_avx(auVar68,auVar57,auVar65);
                auVar56 = vblendvpd_avx(auVar69,auVar67,auVar65);
                auVar55 = vpalignr_avx2(auVar55,auVar11,8);
                auVar73 = vblendvpd_avx(local_238,auVar55,auVar65);
                lVar27 = 0;
                auVar75 = ZEXT3264(auVar75._0_32_);
                auVar79 = ZEXT3264(auVar79._0_32_);
                do {
                  auVar69 = *(undefined1 (*) [32])((long)*ptr + lVar27);
                  auVar12._8_4_ = open;
                  auVar12._0_8_ = uVar39;
                  auVar12._12_4_ = 0;
                  auVar12._16_4_ = open;
                  auVar12._20_4_ = 0;
                  auVar12._24_4_ = open;
                  auVar12._28_4_ = 0;
                  auVar77 = vpsubq_avx2(auVar48,auVar12);
                  auVar71 = vpsubq_avx2(auVar71,auVar45);
                  auVar48 = vpcmpgtq_avx2(auVar77,auVar71);
                  auVar57 = vblendvpd_avx(auVar57,auVar61,auVar48);
                  auVar67 = vblendvpd_avx(auVar67,auVar56,auVar48);
                  auVar55 = vblendvpd_avx(auVar55,auVar73,auVar48);
                  auVar71 = vblendvpd_avx(auVar71,auVar77,auVar48);
                  auVar73 = *(undefined1 (*) [32])((long)*b + lVar27);
                  auVar61 = vpcmpgtq_avx2(auVar69,auVar73);
                  auVar73 = vblendvpd_avx(auVar73,auVar69,auVar61);
                  auVar77 = vpcmpgtq_avx2(auVar73,auVar71);
                  auVar48 = vblendvpd_avx(auVar71,auVar73,auVar77);
                  auVar73 = vblendvpd_avx(auVar57,*(undefined1 (*) [32])((long)*b_00 + lVar27),
                                          auVar77);
                  auVar50._0_8_ = -(ulong)(auVar48._0_8_ == auVar69._0_8_);
                  auVar50._8_8_ = -(ulong)(auVar48._8_8_ == auVar69._8_8_);
                  auVar50._16_8_ = -(ulong)(auVar48._16_8_ == auVar69._16_8_);
                  auVar50._24_8_ = -(ulong)(auVar48._24_8_ == auVar69._24_8_);
                  auVar61 = vblendvpd_avx(auVar73,*(undefined1 (*) [32])((long)*b_03 + lVar27),
                                          auVar50);
                  auVar73 = vblendvpd_avx(auVar67,*(undefined1 (*) [32])((long)*b_01 + lVar27),
                                          auVar77);
                  auVar56 = vblendvpd_avx(auVar73,*(undefined1 (*) [32])((long)*b_04 + lVar27),
                                          auVar50);
                  auVar55 = vpsubq_avx2(auVar55,_DAT_00909280);
                  auVar73 = vblendvpd_avx(auVar55,*(undefined1 (*) [32])((long)*b_02 + lVar27),
                                          auVar77);
                  auVar73 = vblendvpd_avx(auVar73,*(undefined1 (*) [32])((long)*b_05 + lVar27),
                                          auVar50);
                  *(undefined1 (*) [32])((long)*ptr + lVar27) = auVar48;
                  *(undefined1 (*) [32])((long)*b_03 + lVar27) = auVar61;
                  *(undefined1 (*) [32])((long)*b_04 + lVar27) = auVar56;
                  *(undefined1 (*) [32])((long)*b_05 + lVar27) = auVar73;
                  auVar69 = vpcmpgtq_avx2(auVar48,auVar75._0_32_);
                  auVar69 = vblendvpd_avx(auVar48,auVar75._0_32_,auVar69);
                  auVar75 = ZEXT3264(auVar69);
                  auVar77 = vpcmpgtq_avx2(auVar79._0_32_,auVar48);
                  auVar77 = vblendvpd_avx(auVar48,auVar79._0_32_,auVar77);
                  auVar11 = vpcmpgtq_avx2(auVar77,auVar61);
                  auVar77 = vblendvpd_avx(auVar61,auVar77,auVar11);
                  auVar11 = vpcmpgtq_avx2(auVar77,auVar56);
                  auVar77 = vblendvpd_avx(auVar56,auVar77,auVar11);
                  auVar11 = vpcmpgtq_avx2(auVar77,auVar73);
                  auVar77 = vblendvpd_avx(auVar73,auVar77,auVar11);
                  auVar79 = ZEXT3264(auVar77);
                  lVar27 = lVar27 + 0x20;
                } while (lVar24 != lVar27);
                alVar13 = ptr[uVar10];
                auVar55 = vpcmpgtq_avx2((undefined1  [32])alVar13,auVar49);
                auVar73 = vpcmpgtq_avx2(auVar49,(undefined1  [32])alVar13);
                auVar73 = vblendvpd_avx((undefined1  [32])alVar13,auVar49,auVar73);
                auVar44 = auVar73._16_16_;
                auVar72 = ZEXT3264(auVar73);
                auVar73 = vblendvpd_avx(auVar70._0_32_,(undefined1  [32])b_03[uVar10],auVar55);
                auVar53 = auVar73._16_16_;
                auVar70 = ZEXT3264(auVar73);
                auVar73 = vblendvpd_avx(auVar66._0_32_,(undefined1  [32])b_04[uVar10],auVar55);
                auVar58 = auVar73._16_16_;
                auVar66 = ZEXT3264(auVar73);
                auVar73 = vblendvpd_avx(auVar62._0_32_,(undefined1  [32])b_05[uVar10],auVar55);
                auVar42 = auVar73._16_16_;
                auVar62 = ZEXT3264(auVar73);
                auVar15._8_8_ = -(ulong)(iVar32 == 2);
                auVar15._0_8_ = -(ulong)(iVar32 == 3);
                auVar15._16_8_ = -(ulong)(iVar32 == 1);
                auVar15._24_8_ = -(ulong)(iVar82 == -3);
                auVar15 = auVar15 & auVar55;
                if ((((auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar15 >> 0x7f,0) != '\0') || SUB321(auVar15 >> 0xbf,0) != '\0') ||
                    auVar15[0x1f] < '\0') {
                  local_2d8 = (int)uVar26;
                }
                uVar26 = uVar1;
              } while (uVar1 != (uint)s2Len);
              if (s2_end == 0) {
                lVar33 = 0;
                lVar36 = 0;
                local_2f8._0_8_ = 0;
              }
              else {
                if (iVar19 < 3) {
                  iVar21 = 0;
                  do {
                    auVar47 = auVar72._0_32_;
                    auVar73 = vperm2f128_avx(auVar47,auVar47,8);
                    auVar73 = vpalignr_avx2(auVar47,auVar73,8);
                    auVar44 = auVar73._16_16_;
                    auVar72 = ZEXT3264(auVar73);
                    auVar47 = auVar70._0_32_;
                    auVar73 = vperm2f128_avx(auVar47,auVar47,8);
                    auVar73 = vpalignr_avx2(auVar47,auVar73,8);
                    auVar53 = auVar73._16_16_;
                    auVar70 = ZEXT3264(auVar73);
                    auVar47 = auVar66._0_32_;
                    auVar73 = vperm2f128_avx(auVar47,auVar47,8);
                    auVar73 = vpalignr_avx2(auVar47,auVar73,8);
                    auVar58 = auVar73._16_16_;
                    auVar66 = ZEXT3264(auVar73);
                    auVar47 = auVar62._0_32_;
                    auVar73 = vperm2f128_avx(auVar47,auVar47,8);
                    auVar73 = vpalignr_avx2(auVar47,auVar73,8);
                    auVar42 = auVar73._16_16_;
                    auVar62 = ZEXT3264(auVar73);
                    iVar21 = iVar21 + 1;
                  } while (iVar21 < iVar32);
                }
                uVar40 = vpextrq_avx(auVar44,1);
                lVar33 = vpextrq_avx(auVar53,1);
                lVar36 = vpextrq_avx(auVar58,1);
                local_2f8._0_8_ = vpextrq_avx(auVar42,1);
              }
              iVar28 = (int)lVar36;
              iVar21 = (int)lVar33;
              uVar22 = uVar35;
              if ((s1_end != 0) && ((uVar83 & 0x7ffffffc) != 0)) {
                uVar39 = 0;
                uVar83 = uVar40;
                do {
                  uVar29 = ((uint)uVar39 & 3) * uVar80 + ((uint)(uVar39 >> 2) & 0x3fffffff);
                  uVar40 = uVar83;
                  if ((int)uVar29 < (int)uVar5) {
                    uVar25 = (*ptr)[uVar39];
                    uVar40 = uVar25;
                    if (((long)uVar83 < (long)uVar25) ||
                       (((uVar40 = uVar83, uVar25 == uVar83 && (local_2d8 == iVar20)) &&
                        ((int)uVar29 < (int)uVar22)))) {
                      lVar33 = (*b_03)[uVar39];
                      lVar36 = (*b_04)[uVar39];
                      local_2f8._0_8_ = (*b_05)[uVar39];
                      local_2d8 = iVar20;
                      uVar22 = uVar29;
                    }
                  }
                  iVar28 = (int)lVar36;
                  iVar21 = (int)lVar33;
                  uVar39 = uVar39 + 1;
                  uVar83 = uVar40;
                } while ((uVar80 & 0x1fffffff) << 2 != (int)uVar39);
              }
              iVar82 = (int)uVar40;
              if (s2_end == 0 && s1_end == 0) {
                alVar13 = ptr[uVar10];
                auVar44 = alVar13._16_16_;
                alVar2 = b_03[uVar10];
                auVar53 = alVar2._16_16_;
                alVar3 = b_04[uVar10];
                auVar58 = alVar3._16_16_;
                alVar4 = b_05[uVar10];
                auVar42 = alVar4._16_16_;
                if (iVar19 < 3) {
                  iVar21 = 0;
                  do {
                    auVar73 = vperm2i128_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar13,8)
                    ;
                    alVar13 = (__m256i)vpalignr_avx2((undefined1  [32])alVar13,auVar73,8);
                    auVar44 = alVar13._16_16_;
                    auVar73 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8);
                    alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar73,8);
                    auVar53 = alVar2._16_16_;
                    auVar73 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,8);
                    alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar73,8);
                    auVar58 = alVar3._16_16_;
                    auVar73 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                    alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar73,8);
                    auVar42 = alVar4._16_16_;
                    iVar21 = iVar21 + 1;
                  } while (iVar21 < iVar32);
                }
                uVar34 = vpextrq_avx(auVar44,1);
                iVar82 = (int)uVar34;
                uVar34 = vpextrq_avx(auVar53,1);
                iVar21 = (int)uVar34;
                uVar34 = vpextrq_avx(auVar58,1);
                iVar28 = (int)uVar34;
                uVar34 = vpextrq_avx(auVar42,1);
                local_2f8._0_4_ = (undefined4)uVar34;
                uVar22 = uVar35;
                local_2d8 = iVar20;
              }
              auVar16._8_8_ = uVar30;
              auVar16._0_8_ = uVar30;
              auVar16._16_8_ = uVar30;
              auVar16._24_8_ = uVar30;
              auVar73 = vpcmpgtq_avx2(auVar16,auVar69);
              auVar17._8_8_ = lVar37;
              auVar17._0_8_ = lVar37;
              auVar17._16_8_ = lVar37;
              auVar17._24_8_ = lVar37;
              auVar47 = vpcmpgtq_avx2(auVar77,auVar17);
              auVar73 = vpor_avx2(auVar47,auVar73);
              if ((((auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   SUB321(auVar73 >> 0x7f,0) != '\0') || SUB321(auVar73 >> 0xbf,0) != '\0') ||
                  auVar73[0x1f] < '\0') {
                *(byte *)&ppVar23->flag = (byte)ppVar23->flag | 0x40;
                iVar82 = 0;
                iVar21 = 0;
                iVar28 = 0;
                local_2f8._0_4_ = 0;
                local_2d8 = 0;
                uVar22 = 0;
              }
              ppVar23->score = iVar82;
              ppVar23->end_query = uVar22;
              ppVar23->end_ref = local_2d8;
              ((ppVar23->field_4).stats)->matches = iVar21;
              ((ppVar23->field_4).stats)->similar = iVar28;
              ((ppVar23->field_4).stats)->length = local_2f8._0_4_;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar23;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile64.score;
    pvPm = (__m256i*)profile->profile64.matches;
    pvPs = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            vGapperL = _mm256_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHpM = _mm256_slli_si256_rpl(vHpM, 8);
        vHpS = _mm256_slli_si256_rpl(vHpS, 8);
        vHpL = _mm256_slli_si256_rpl(vHpL, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_sub_epi64(vH, vGapO);
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vGapper = _mm256_add_epi64(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vF, vGapper),
                    _mm256_cmpeq_epi64(vF, vGapper));
            vF = _mm256_max_epi64_rpl(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_add_epi64(vHp, vW);
            vHpM = _mm256_add_epi64(vHpM, vWM);
            vHpS = _mm256_add_epi64(vHpS, vWS);
            vHpL = _mm256_add_epi64(vHpL, vOne);
            case1 = _mm256_cmpgt_epi64(vE, vHp);
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHtM = _mm256_slli_si256_rpl(vHtM, 8);
        vHtS = _mm256_slli_si256_rpl(vHtS, 8);
        vHtL = _mm256_slli_si256_rpl(vHtL, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_add_epi64(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi64(vGapper, vF),
                _mm256_cmpeq_epi64(vGapper, vF));
        vF = _mm256_max_epi64_rpl(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 8);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 8);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi64(vFt, vF),
                    _mm256_cmpeq_epi64(vFt, vF));
            vF = _mm256_max_epi64_rpl(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vFM = _mm256_slli_si256_rpl(vFM, 8);
        vFS = _mm256_slli_si256_rpl(vFS, 8);
        vFL = _mm256_slli_si256_rpl(vFL, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi64(vF, vHt);
        vH = _mm256_max_epi64_rpl(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_sub_epi64(vH, vGapO);
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vH = _mm256_max_epi64_rpl(vHp, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            case1 = _mm256_cmpeq_epi64(vH, vHp);
            case2 = _mm256_cmpeq_epi64(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            cond_max = _mm256_cmpgt_epi64(vH, vMaxH);
            vMaxH = _mm256_max_epi64_rpl(vMaxH, vH);
            vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
                vHM = _mm256_slli_si256_rpl(vHM, 8);
                vHS = _mm256_slli_si256_rpl(vHS, 8);
                vHL = _mm256_slli_si256_rpl(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
            vMaxM = _mm256_slli_si256_rpl(vMaxM, 8);
            vMaxS = _mm256_slli_si256_rpl(vMaxS, 8);
            vMaxL = _mm256_slli_si256_rpl(vMaxL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl(vMaxM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl(vMaxS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl(vMaxL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int64_t *m = (int64_t*)pvHM;
        int64_t *s = (int64_t*)pvHS;
        int64_t *l = (int64_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}